

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O3

void __thiscall
QDataWidgetMapperPrivate::dataChanged
          (QDataWidgetMapperPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight,
          QList<int> *param_3)

{
  QAbstractItemModel *pQVar1;
  WidgetMapper *pWVar2;
  char cVar3;
  int iVar4;
  QModelIndex *pQVar5;
  WidgetMapper *e;
  WidgetMapper *m;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (topLeft->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_58.r = -1;
    local_58.c = -1;
    local_58.i = 0;
    local_58.m.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_58,pQVar1,topLeft);
  }
  cVar3 = comparesEqual(&this->rootIndex,&local_58);
  if (cVar3 != '\0') {
    pWVar2 = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (m = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_start; m != pWVar2; m = m + 1) {
      pQVar5 = QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&m->currentIndex);
      auVar6._0_4_ = -(uint)(bottomRight->r < local_58.r);
      auVar6._4_4_ = -(uint)(bottomRight->c < local_58.c);
      auVar6._8_4_ = -(uint)(local_58.r < topLeft->r);
      auVar6._12_4_ = -(uint)(local_58.c < topLeft->c);
      iVar4 = movmskps((int)pQVar5,auVar6);
      if (iVar4 == 0) {
        populate(this,m);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapperPrivate::dataChanged(const QModelIndex &topLeft,
                                           const QModelIndex &bottomRight, const QList<int> &)
{
    if (topLeft.parent() != rootIndex)
        return; // not in our hierarchy

    for (WidgetMapper &e : widgetMap) {
        if (qContainsIndex(e.currentIndex, topLeft, bottomRight))
            populate(e);
    }
}